

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledRepresentation::~IfcStyledRepresentation
          (IfcStyledRepresentation *this)

{
  ~IfcStyledRepresentation
            ((IfcStyledRepresentation *)
             &this[-1].super_IfcStyleModel.super_IfcRepresentation.field_0x28);
  return;
}

Assistant:

IfcStyledRepresentation() : Object("IfcStyledRepresentation") {}